

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_glsl_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  bool bVar1;
  uint32_t uVar2;
  BaseType BVar3;
  BaseType input_type;
  GLSLstd450 GVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  SPIRType *pSVar8;
  char *op_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar9;
  bool local_5f2;
  bool local_5e2;
  bool local_5aa;
  undefined1 local_4f8 [32];
  undefined1 local_4d8 [44];
  uint32_t tmp_type_id;
  uint32_t *tmp_id;
  char local_4a0;
  bool local_491;
  SPIRType *pSStack_490;
  bool is_thread_storage;
  SPIRType *type;
  SPIRExpression *ptr;
  SPIRType *exp_type;
  undefined1 local_458 [64];
  undefined1 local_418 [32];
  undefined1 local_3f8 [64];
  spirv_cross local_3b8 [32];
  char *local_398;
  spirv_cross local_390 [32];
  undefined1 local_370 [64];
  SPIRConstant *local_330;
  SPIRConstant *c_2;
  string local_320 [4];
  uint32_t index_expr_2;
  string component_2;
  undefined1 local_2f8 [4];
  uint32_t interface_index_2;
  undefined1 local_2d8 [64];
  spirv_cross local_298 [32];
  TypedID<(spirv_cross::Types)0> *local_278;
  spirv_cross local_270 [32];
  undefined1 local_250 [64];
  SPIRConstant *local_210;
  SPIRConstant *c_1;
  string local_200 [4];
  uint32_t index_expr_1;
  string component_1;
  undefined1 local_1d8 [4];
  uint32_t interface_index_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8 [32];
  spirv_cross local_198 [32];
  char *local_178;
  spirv_cross local_170 [32];
  undefined1 local_150 [64];
  SPIRConstant *local_110;
  SPIRConstant *c;
  string local_100 [4];
  uint32_t index_expr;
  string component;
  uint32_t interface_index;
  SPIRType *mat_type;
  spirv_cross local_b0 [8];
  string expr_1;
  undefined1 local_80 [40];
  string expr;
  BaseType basetype;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  GLSLstd450 op;
  uint32_t count_local;
  uint32_t *args_local;
  uint32_t local_18;
  uint32_t eop_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerMSL *this_local;
  
  local_18 = id;
  eop_local = result_type;
  _id_local = (_Hash_node_base *)this;
  uVar2 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  BVar3 = to_signed_basetype(uVar2);
  input_type = to_unsigned_basetype(uVar2);
  GVar4 = CompilerGLSL::get_remapped_glsl_op(&this->super_CompilerGLSL,eop);
  uVar2 = (uint32_t)this;
  switch(GVar4) {
  case GLSLstd450RoundEven:
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*args,"rint");
    break;
  default:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    break;
  case GLSLstd450Sinh:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"fast::sinh");
    break;
  case GLSLstd450Cosh:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"fast::cosh");
    break;
  case GLSLstd450Tanh:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"precise::tanh");
    break;
  case GLSLstd450Atan2:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"precise::atan2");
    break;
  case GLSLstd450InverseSqrt:
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*args,"rsqrt");
    break;
  case GLSLstd450MatrixInverse:
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    uVar2 = pSVar8->columns;
    if (uVar2 == 2) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvInverse2x2");
    }
    else if (uVar2 == 3) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvInverse3x3");
    }
    else if (uVar2 == 4) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvInverse4x4");
    }
    break;
  case GLSLstd450Modf:
  case GLSLstd450Frexp:
    type = (SPIRType *)Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,args[1]);
    pSStack_490 = Compiler::expression_type((Compiler *)this,args[1]);
    local_491 = storage_class_array_is_thread(pSStack_490->storage);
    if ((pSStack_490->storage == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) != 0)
       ) {
      local_491 = false;
    }
    if (local_491 == false) {
LAB_0049f9e9:
      CompilerGLSL::register_call_out_argument(&this->super_CompilerGLSL,args[1]);
      pVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,&local_18);
      tmp_id = (uint32_t *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_4a0 = pVar9.second;
      register0x00000000 =
           (Variant *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&(this->super_CompilerGLSL).extra_sub_expressions,&local_18);
      if (*(mapped_type *)&register0x00000000->group == 0) {
        uVar6 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        *(uint32_t *)&stack0xfffffffffffffb50->group = uVar6;
      }
      uVar6 = Compiler::expression_type_id((Compiler *)this,args[1]);
      local_4d8._36_4_ = Compiler::get_pointee_type_id((Compiler *)this,uVar6);
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,local_4d8._36_4_,
                 *(uint32_t *)&stack0xfffffffffffffb50->group);
      op_00 = "frexp";
      if (eop == 0x23) {
        op_00 = "modf";
      }
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,
                 *(uint32_t *)&stack0xfffffffffffffb50->group,op_00);
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_4d8,uVar2,SUB41(args[1],0));
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_4f8,uVar2,
                 SUB41(*(mapped_type *)&stack0xfffffffffffffb50->group,0));
      CompilerGLSL::
      statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8,
                 (char (*) [4])0x5cb349,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8,
                 (char (*) [2])0x5b3b6f);
      ::std::__cxx11::string::~string((string *)local_4f8);
      ::std::__cxx11::string::~string((string *)local_4d8);
    }
    else {
      if ((type != (SPIRType *)0x0) && (((type->array).stack_storage.aligned_char[2] & 1U) != 0)) {
        pSVar8 = Compiler::expression_type((Compiler *)this,args[1]);
        bVar1 = Compiler::is_scalar((Compiler *)this,pSVar8);
        if (bVar1) goto LAB_0049f9e9;
      }
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450FMin:
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"fast::min");
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"min");
    }
    break;
  case GLSLstd450FMax:
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"fast::max");
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"max");
    }
    break;
  case GLSLstd450FClamp:
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"fast::clamp");
    }
    else {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"clamp");
    }
    break;
  case GLSLstd450PackSnorm4x8:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"pack_float_to_snorm4x8");
    break;
  case GLSLstd450PackUnorm4x8:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"pack_float_to_unorm4x8");
    break;
  case GLSLstd450PackSnorm2x16:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"pack_float_to_snorm2x16");
    break;
  case GLSLstd450PackUnorm2x16:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"pack_float_to_unorm2x16");
    break;
  case GLSLstd450PackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_80,uVar2,SUB41(*args,0));
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[3]>
              ((spirv_cross *)(local_80 + 0x20),(char (*) [21])"as_type<uint>(half2(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               (char (*) [3])0x5c674f);
    ::std::__cxx11::string::~string((string *)local_80);
    uVar6 = eop_local;
    uVar2 = local_18;
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op
              (&this->super_CompilerGLSL,uVar6,uVar2,(string *)(local_80 + 0x20),bVar1,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,local_18,*args);
    ::std::__cxx11::string::~string((string *)(local_80 + 0x20));
    break;
  case GLSLstd450PackDouble2x32:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,
               "unsupported_GLSLstd450PackDouble2x32");
    break;
  case GLSLstd450UnpackSnorm2x16:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"unpack_snorm2x16_to_float");
    break;
  case GLSLstd450UnpackUnorm2x16:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"unpack_unorm2x16_to_float");
    break;
  case GLSLstd450UnpackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)&mat_type,uVar2,SUB41(*args,0));
    join<char_const(&)[23],std::__cxx11::string,char_const(&)[3]>
              (local_b0,(char (*) [23])"float2(as_type<half2>(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat_type,
               (char (*) [3])0x5c674f);
    ::std::__cxx11::string::~string((string *)&mat_type);
    uVar6 = eop_local;
    uVar2 = local_18;
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,uVar2,(string *)local_b0,bVar1,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,local_18,*args);
    ::std::__cxx11::string::~string((string *)local_b0);
    break;
  case GLSLstd450UnpackSnorm4x8:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"unpack_snorm4x8_to_float");
    break;
  case GLSLstd450UnpackUnorm4x8:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"unpack_unorm4x8_to_float");
    break;
  case GLSLstd450UnpackDouble2x32:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,
               "unsupported_GLSLstd450UnpackDouble2x32");
    break;
  case GLSLstd450Length:
    pSVar8 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar8->vecsize == 1) {
      CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*args,"abs");
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450Distance:
    pSVar8 = Compiler::expression_type((Compiler *)this,*args);
    uVar5 = eop_local;
    uVar6 = local_18;
    if (pSVar8->vecsize == 1) {
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                ((CompilerGLSL *)local_458,uVar2,SUB41(*args,0));
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                ((CompilerGLSL *)&exp_type,uVar2,SUB41(args[1],0));
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                ((spirv_cross *)(local_458 + 0x20),(char (*) [5])"abs(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                 (char (*) [4])0x5b9169,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exp_type,
                 (char (*) [2])0x5b48c4);
      bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      local_5f2 = false;
      if (bVar1) {
        local_5f2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar5,uVar6,(string *)(local_458 + 0x20),local_5f2,false)
      ;
      ::std::__cxx11::string::~string((string *)(local_458 + 0x20));
      ::std::__cxx11::string::~string((string *)&exp_type);
      ::std::__cxx11::string::~string((string *)local_458);
      Compiler::inherit_expression_dependencies((Compiler *)this,local_18,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,local_18,args[1]);
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450Normalize:
    ptr = (SPIRExpression *)Compiler::expression_type((Compiler *)this,*args);
    if (((SPIRType *)ptr)->vecsize == 1) {
      CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*args,"sign");
    }
    else if ((((SPIRType *)ptr)->vecsize < 4) &&
            (*(int *)&(((SPIRType *)ptr)->super_IVariant).field_0xc == 0xc)) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"normalize");
    }
    else {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"fast::normalize");
    }
    break;
  case GLSLstd450FaceForward:
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar8->vecsize == 1) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"spvFaceForward"
                );
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450Reflect:
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar8->vecsize == 1) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"spvReflect");
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450Refract:
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar8->vecsize == 1) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"spvRefract");
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450FindILsb:
    pSVar8 = Compiler::expression_type((Compiler *)this,*args);
    BVar3 = *(BaseType *)&(pSVar8->super_IVariant).field_0xc;
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvFindLSB",BVar3,BVar3);
    break;
  case GLSLstd450FindSMsb:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvFindSMSB",BVar3,BVar3);
    break;
  case GLSLstd450FindUMsb:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvFindUMSB",input_type,
               input_type);
    break;
  case GLSLstd450InterpolateAtCentroid:
    Compiler::get_extended_decoration
              ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    ::std::__cxx11::string::string(local_100);
    bVar1 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar1) {
      c._4_4_ = Compiler::get_extended_decoration
                          ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      local_110 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,c._4_4_);
      if ((local_110 == (SPIRConstant *)0x0) || ((local_110->specialization & 1U) != 0)) {
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_150,uVar2,SUB41(c._4_4_,0));
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((spirv_cross *)(local_150 + 0x20),(char (*) [2])0x5b2ad8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   (char (*) [2])0x5ab046);
        ::std::__cxx11::string::operator=(local_100,(string *)(local_150 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_150 + 0x20));
        ::std::__cxx11::string::~string((string *)local_150);
      }
      else {
        uVar2 = SPIRConstant::scalar(local_110,0,0);
        local_178 = CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar2);
        join<char_const(&)[2],char_const*>(local_170,(char (*) [2])0x5b4654,&local_178);
        ::std::__cxx11::string::operator=(local_100,(string *)local_170);
        ::std::__cxx11::string::~string((string *)local_170);
      }
    }
    uVar6 = eop_local;
    uVar2 = local_18;
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_1b8,this,(ulong)uVar5,1);
    pSVar8 = get_stage_in_struct_type(this);
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)local_1d8,(SPIRType *)this,(uint32_t)pSVar8);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[27],std::__cxx11::string&>
              (local_198,local_1b8,(char (*) [2])0x5b4654,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
               (char (*) [27])".interpolate_at_centroid()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,uVar2,(string *)local_198,bVar1,false);
    ::std::__cxx11::string::~string((string *)local_198);
    ::std::__cxx11::string::~string((string *)local_1d8);
    ::std::__cxx11::string::~string((string *)local_1b8);
    ::std::__cxx11::string::~string(local_100);
    break;
  case GLSLstd450InterpolateAtSample:
    Compiler::get_extended_decoration
              ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    ::std::__cxx11::string::string(local_200);
    bVar1 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar1) {
      c_1._4_4_ = Compiler::get_extended_decoration
                            ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      local_210 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,c_1._4_4_);
      if ((local_210 == (SPIRConstant *)0x0) || ((local_210->specialization & 1U) != 0)) {
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_250,uVar2,SUB41(c_1._4_4_,0));
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((spirv_cross *)(local_250 + 0x20),(char (*) [2])0x5b2ad8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [2])0x5ab046);
        ::std::__cxx11::string::operator=(local_200,(string *)(local_250 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_250 + 0x20));
        ::std::__cxx11::string::~string((string *)local_250);
      }
      else {
        uVar6 = SPIRConstant::scalar(local_210,0,0);
        local_278 = (TypedID<(spirv_cross::Types)0> *)
                    CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar6);
        join<char_const(&)[2],char_const*>(local_270,(char (*) [2])0x5b4654,(char **)&local_278);
        ::std::__cxx11::string::operator=(local_200,(string *)local_270);
        ::std::__cxx11::string::~string((string *)local_270);
      }
    }
    uVar5 = eop_local;
    uVar6 = local_18;
    uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_2d8 + 0x20,this,(ulong)uVar7,1);
    pSVar8 = get_stage_in_struct_type(this);
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)local_2d8,(SPIRType *)this,(uint32_t)pSVar8);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_2f8,uVar2,SUB41(args[1],0));
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_2d8 + 0x20),(char (*) [2])0x5b4654,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
               (char (*) [24])".interpolate_at_sample(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
               (char (*) [2])0x5b48c4,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    local_5aa = false;
    if (bVar1) {
      local_5aa = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar5,uVar6,(string *)local_298,local_5aa,false)
    ;
    ::std::__cxx11::string::~string((string *)local_298);
    ::std::__cxx11::string::~string((string *)local_2f8);
    ::std::__cxx11::string::~string((string *)local_2d8);
    ::std::__cxx11::string::~string((string *)(local_2d8 + 0x20));
    ::std::__cxx11::string::~string(local_200);
    break;
  case GLSLstd450InterpolateAtOffset:
    Compiler::get_extended_decoration
              ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    ::std::__cxx11::string::string(local_320);
    bVar1 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar1) {
      c_2._4_4_ = Compiler::get_extended_decoration
                            ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      local_330 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,c_2._4_4_);
      if ((local_330 == (SPIRConstant *)0x0) || ((local_330->specialization & 1U) != 0)) {
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_370,uVar2,SUB41(c_2._4_4_,0));
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((spirv_cross *)(local_370 + 0x20),(char (*) [2])0x5b2ad8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                   (char (*) [2])0x5ab046);
        ::std::__cxx11::string::operator=(local_320,(string *)(local_370 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_370 + 0x20));
        ::std::__cxx11::string::~string((string *)local_370);
      }
      else {
        uVar6 = SPIRConstant::scalar(local_330,0,0);
        local_398 = CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar6);
        join<char_const(&)[2],char_const*>(local_390,(char (*) [2])0x5b4654,&local_398);
        ::std::__cxx11::string::operator=(local_320,(string *)local_390);
        ::std::__cxx11::string::~string((string *)local_390);
      }
    }
    uVar5 = eop_local;
    uVar6 = local_18;
    uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_3f8 + 0x20,this,(ulong)uVar7,1);
    pSVar8 = get_stage_in_struct_type(this);
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)local_3f8,(SPIRType *)this,(uint32_t)pSVar8);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_418,uVar2,SUB41(args[1],0));
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[11],std::__cxx11::string&>
              (local_3b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_3f8 + 0x20),(char (*) [2])0x5b4654,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
               (char (*) [24])".interpolate_at_offset(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
               (char (*) [11])" + 0.4375)",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    local_5e2 = false;
    if (bVar1) {
      local_5e2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar5,uVar6,(string *)local_3b8,local_5e2,false)
    ;
    ::std::__cxx11::string::~string((string *)local_3b8);
    ::std::__cxx11::string::~string((string *)local_418);
    ::std::__cxx11::string::~string((string *)local_3f8);
    ::std::__cxx11::string::~string((string *)(local_3f8 + 0x20));
    ::std::__cxx11::string::~string(local_320);
    break;
  case GLSLstd450NMin:
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"precise::min");
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"min");
    }
    break;
  case GLSLstd450NMax:
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"precise::max");
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"max");
    }
    break;
  case GLSLstd450NClamp:
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"precise::clamp"
                );
    }
    else {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"clamp");
    }
  }
  return;
}

Assistant:

void CompilerMSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	op = get_remapped_glsl_op(op);

	switch (op)
	{
	case GLSLstd450Sinh:
		emit_unary_func_op(result_type, id, args[0], "fast::sinh");
		break;
	case GLSLstd450Cosh:
		emit_unary_func_op(result_type, id, args[0], "fast::cosh");
		break;
	case GLSLstd450Tanh:
		emit_unary_func_op(result_type, id, args[0], "precise::tanh");
		break;
	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "precise::atan2");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;
	case GLSLstd450RoundEven:
		emit_unary_func_op(result_type, id, args[0], "rint");
		break;

	case GLSLstd450FindILsb:
	{
		// In this template version of findLSB, we return T.
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindLSB", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindSMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindUMSB", uint_type, uint_type);
		break;

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm2x16");
		break;

	case GLSLstd450PackHalf2x16:
	{
		auto expr = join("as_type<uint>(half2(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm4x8_to_float");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm4x8_to_float");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm2x16_to_float");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm2x16_to_float");
		break;

	case GLSLstd450UnpackHalf2x16:
	{
		auto expr = join("float2(as_type<half2>(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450PackDouble2x32"); // Currently unsupported
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450UnpackDouble2x32"); // Currently unsupported
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &mat_type = get<SPIRType>(result_type);
		switch (mat_type.columns)
		{
		case 2:
			emit_unary_func_op(result_type, id, args[0], "spvInverse2x2");
			break;
		case 3:
			emit_unary_func_op(result_type, id, args[0], "spvInverse3x3");
			break;
		case 4:
			emit_unary_func_op(result_type, id, args[0], "spvInverse4x4");
			break;
		default:
			break;
		}
		break;
	}

	case GLSLstd450FMin:
		// If the result type isn't float, don't bother calling the specific
		// precise::/fast:: version. Metal doesn't have those for half and
		// double types.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::min");
		break;

	case GLSLstd450FMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::max");
		break;

	case GLSLstd450FClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fast::clamp");
		break;

	case GLSLstd450NMin:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::min");
		break;

	case GLSLstd450NMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::max");
		break;

	case GLSLstd450NClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "precise::clamp");
		break;

	case GLSLstd450InterpolateAtCentroid:
	{
		// We can't just emit the expression normally, because the qualified name contains a call to the default
		// interpolate method, or refers to a local variable. We saved the interface index we need; use it to construct
		// the base for the method call.
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_centroid()", component),
		        should_forward(args[0]));
		break;
	}

	case GLSLstd450InterpolateAtSample:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_sample(", to_expression(args[1]), ")", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450InterpolateAtOffset:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		// Like Direct3D, Metal puts the (0, 0) at the upper-left corner, not the center as SPIR-V and GLSL do.
		// Offset the offset by (1/2 - 1/16), or 0.4375, to compensate for this.
		// It has to be (1/2 - 1/16) and not 1/2, or several CTS tests subtly break on Intel.
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_offset(", to_expression(args[1]), " + 0.4375)", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450Distance:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to length(a - b) -> abs(a - b).
			emit_op(result_type, id,
			        join("abs(", to_enclosed_unpacked_expression(args[0]), " - ",
			             to_enclosed_unpacked_expression(args[1]), ")"),
			        should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Length:
		// MSL does not support scalar versions, so use abs().
		if (expression_type(args[0]).vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "abs");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Normalize:
	{
		auto &exp_type = expression_type(args[0]);
		// MSL does not support scalar versions here.
		// MSL has no implementation for normalize in the fast:: namespace for half2 and half3
		// Returns -1 or 1 for valid input, sign() does the job.
		if (exp_type.vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "sign");
		else if (exp_type.vecsize <= 3 && exp_type.basetype == SPIRType::Half)
			emit_unary_func_op(result_type, id, args[0], "normalize");
		else
			emit_unary_func_op(result_type, id, args[0], "fast::normalize");
		break;
	}
	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Modf:
	case GLSLstd450Frexp:
	{
		// Special case. If the variable is a scalar access chain, we cannot use it directly. We have to emit a temporary.
		// Another special case is if the variable is in a storage class which is not thread.
		auto *ptr = maybe_get<SPIRExpression>(args[1]);
		auto &type = expression_type(args[1]);

		bool is_thread_storage = storage_class_array_is_thread(type.storage);
		if (type.storage == StorageClassOutput && capture_output_to_buffer)
			is_thread_storage = false;

		if (!is_thread_storage ||
		    (ptr && ptr->access_chain && is_scalar(expression_type(args[1]))))
		{
			register_call_out_argument(args[1]);
			forced_temporaries.insert(id);

			// Need to create temporaries and copy over to access chain after.
			// We cannot directly take the reference of a vector swizzle in MSL, even if it's scalar ...
			uint32_t &tmp_id = extra_sub_expressions[id];
			if (!tmp_id)
				tmp_id = ir.increase_bound_by(1);

			uint32_t tmp_type_id = get_pointee_type_id(expression_type_id(args[1]));
			emit_uninitialized_temporary_expression(tmp_type_id, tmp_id);
			emit_binary_func_op(result_type, id, args[0], tmp_id, eop == GLSLstd450Modf ? "modf" : "frexp");
			statement(to_expression(args[1]), " = ", to_expression(tmp_id), ";");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}